

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

void spdlog::throw_spdlog_ex(string *msg)

{
  string *psVar1;
  string *msg_00;
  spdlog_ex *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  
  psVar1 = (string *)__cxa_allocate_exception(0x28);
  this = (spdlog_ex *)&stack0xffffffffffffffd8;
  msg_00 = psVar1;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  spdlog_ex::spdlog_ex(this,msg_00);
  __cxa_throw(psVar1,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

SPDLOG_INLINE void throw_spdlog_ex(std::string msg) { SPDLOG_THROW(spdlog_ex(std::move(msg))); }